

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<wchar_t> * __thiscall asl::Array<wchar_t>::insert(Array<wchar_t> *this,int k,wchar_t *x)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  undefined8 *puVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  
  pwVar5 = this->_a;
  wVar1 = pwVar5[-4];
  wVar2 = pwVar5[-3];
  wVar7 = k;
  if (k < 0) {
    wVar7 = wVar1;
  }
  if (wVar1 < wVar2) {
    pwVar4 = pwVar5 + -4;
LAB_001223b0:
    if (wVar1 - wVar7 != 0 && wVar7 <= wVar1) {
      memmove(pwVar5 + (long)wVar7 + 1,pwVar5 + wVar7,(long)(wVar1 - wVar7) << 2);
      pwVar5 = this->_a;
    }
    pwVar5[wVar7] = *x;
    *pwVar4 = wVar1 + L'\x01';
    return this;
  }
  if (wVar1 != L'\x7fffffff') {
    dup(this,k);
    wVar3 = this->_a[-2];
    wVar8 = L'\x7fffffff';
    if (wVar2 < L'\x3ffffffe') {
      wVar8 = wVar2 * 2 + L'\x02';
    }
    pwVar4 = (wchar_t *)realloc(this->_a + -4,(long)wVar8 * 4 + 0x10);
    if (pwVar4 != (wchar_t *)0x0) {
      pwVar5 = pwVar4 + 4;
      this->_a = pwVar5;
      pwVar4[1] = wVar8;
      pwVar4[2] = wVar3;
      goto LAB_001223b0;
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = dup2;
  __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Array<T>& Array<T>::insert(int k, const T& x)
{
	Data* h = &d();
	int n = h->n;
	int s = h->s;
	if (k < 0)
		k = n;
	if (n < s) {}
	else
	{
		s++;
		if (n == 2147483647)
			ASL_BAD_ALLOC();
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		int s1 = s < 1073741823 ? 2 * s : 2147483647;
		char* p = (char*)realloc((char*)_a - sizeof(Data), s1 * sizeof(T) + sizeof(Data));
		if(!p)
			ASL_BAD_ALLOC();
		T* b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		h = &d();
		h->s=s1;
		h->rc = rc;
	}
	if (k < n) {
		memmove((char*)(_a + k + 1), (char*)(_a + k), (n - k) * sizeof(T));
	}
	asl_construct_copy(_a + k, x);
	h->n = n+1;
	return *this;
}